

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

ListValue * __thiscall CoreML::Specification::MILSpec::ListValue::New(ListValue *this,Arena *arena)

{
  ListValue *this_00;
  
  this_00 = (ListValue *)operator_new(0x30);
  ListValue(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::MILSpec::ListValue>(arena,this_00);
  }
  return this_00;
}

Assistant:

ListValue* ListValue::New(::google::protobuf::Arena* arena) const {
  ListValue* n = new ListValue;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}